

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate_data.cc
# Opt level: O0

void __thiscall re2c::Skeleton::emit_data(Skeleton *this,char *fname)

{
  char *pcVar1;
  undefined8 uVar2;
  FILE *__stream;
  FILE *keys;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  undefined1 local_d8 [8];
  string keys_name;
  FILE *input;
  allocator<char> local_99;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_38 [8];
  string input_name;
  char *fname_local;
  Skeleton *this_local;
  
  input_name.field_2._8_8_ = fname;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,fname,&local_99);
  std::operator+(&local_78,&local_98,".");
  std::operator+(&local_58,&local_78,&this->name);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                 &local_58,".input");
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  keys_name.field_2._8_8_ = fopen(pcVar1,"wb");
  uVar2 = input_name.field_2._8_8_;
  if ((FILE *)keys_name.field_2._8_8_ == (FILE *)0x0) {
    uVar2 = std::__cxx11::string::c_str();
    error("cannot open file: %s",uVar2);
    exit(1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,(char *)uVar2,(allocator<char> *)((long)&keys + 7));
  std::operator+(&local_118,&local_138,".");
  std::operator+(&local_f8,&local_118,&this->name);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
                 &local_f8,".keys");
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator((allocator<char> *)((long)&keys + 7));
  pcVar1 = (char *)std::__cxx11::string::c_str();
  __stream = fopen(pcVar1,"wb");
  if (__stream == (FILE *)0x0) {
    uVar2 = std::__cxx11::string::c_str();
    error("cannot open file: %s",uVar2);
    exit(1);
  }
  generate_paths(this,(FILE *)keys_name.field_2._8_8_,(FILE *)__stream);
  fclose((FILE *)keys_name.field_2._8_8_);
  fclose(__stream);
  std::__cxx11::string::~string((string *)local_d8);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void Skeleton::emit_data (const char * fname)
{
	const std::string input_name = std::string (fname) + "." + name + ".input";
	FILE * input = fopen (input_name.c_str (), "wb");
	if (!input)
	{
		error ("cannot open file: %s", input_name.c_str ());
		exit (1);
	}
	const std::string keys_name = std::string (fname) + "." + name + ".keys";
	FILE * keys = fopen (keys_name.c_str (), "wb");
	if (!keys)
	{
		error ("cannot open file: %s", keys_name.c_str ());
		exit (1);
	}

	generate_paths (input, keys);

	fclose (input);
	fclose (keys);
}